

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O3

uint64_t __thiscall bssl::DTLSTimer::MicrosecondsRemaining(DTLSTimer *this,OPENSSL_timeval now)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = (this->expire_time_).tv_sec;
  uVar1 = (this->expire_time_).tv_usec;
  if (uVar1 == 0 && uVar3 == 0) {
    return 0xffffffffffffffff;
  }
  lVar2 = uVar3 - now.tv_sec;
  if ((now.tv_sec <= uVar3) && (uVar4 = now.tv_usec, uVar4 < uVar1 || lVar2 != 0)) {
    uVar5 = uVar1 + 1000000;
    if (uVar1 >= uVar4) {
      uVar5 = uVar1;
    }
    uVar3 = lVar2 - (ulong)(uVar1 < uVar4);
    uVar5 = uVar5 - uVar4;
    if (uVar3 != 0 || 14999 < uVar5) {
      if (0x10c6f7a0b5ed < uVar3) {
        return 0xffffffffffffffff;
      }
      if (CARRY8((ulong)uVar5,uVar3 * 1000000)) {
        return 0xffffffffffffffff;
      }
      return (ulong)uVar5 + uVar3 * 1000000;
    }
  }
  return 0;
}

Assistant:

bool DTLSTimer::IsSet() const {
  return expire_time_.tv_sec != 0 || expire_time_.tv_usec != 0;
}